

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_opt_math.c
# Opt level: O2

_Bool math_abs(gravity_vm *vm,gravity_value_t *args,uint16_t nargs,uint32_t rindex)

{
  gravity_class_t *pgVar1;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar2;
  anon_union_8_3_4e90ac68_for_gravity_value_t_1 aVar3;
  gravity_value_t value;
  gravity_class_t *pgVar4;
  
  pgVar1 = args[1].isa;
  aVar2 = (anon_union_8_3_4e90ac68_for_gravity_value_t_1)args[1].field_1.n;
  pgVar4 = gravity_class_int;
  if (pgVar1 == gravity_class_null && aVar2.n == 0) {
    aVar3.n = 0;
  }
  else if (pgVar1 == gravity_class_int) {
    aVar3.n = -aVar2.n;
    if (0 < aVar2.n) {
      aVar3 = aVar2;
    }
  }
  else if (pgVar1 == gravity_class_float) {
    aVar3.n = aVar2.n & 0x7fffffffffffffff;
    pgVar4 = gravity_class_float;
  }
  else {
    aVar3.n = 1;
    pgVar4 = gravity_class_null;
  }
  value.field_1.n = aVar3.n;
  value.isa = pgVar4;
  gravity_vm_setslot(vm,value,rindex);
  return true;
}

Assistant:

static bool math_abs (gravity_vm *vm, gravity_value_t *args, uint16_t nargs, uint32_t rindex) {
    #pragma unused(vm, nargs)
    gravity_value_t value = GET_VALUE(1);

    if (VALUE_ISA_NULL(value)) {
        RETURN_VALUE(VALUE_FROM_INT(0), rindex);
    }

    if (VALUE_ISA_INT(value)) {
        gravity_int_t computed_value;
        #if GRAVITY_ENABLE_INT64
        computed_value = (gravity_int_t)llabs((long long)value.n);
        #else
        computed_value = (gravity_int_t)labs((long)value.n);
        #endif
        RETURN_VALUE(VALUE_FROM_INT(computed_value), rindex);
    }

    if (VALUE_ISA_FLOAT(value)) {
        gravity_float_t computed_value;
        #if GRAVITY_ENABLE_DOUBLE
        computed_value = (gravity_float_t)fabs((double)value.f);
        #else
        computed_value = (gravity_float_t)fabsf((float)value.f);
        #endif
        RETURN_VALUE(VALUE_FROM_FLOAT(computed_value), rindex);
    }

    // should be NaN
    RETURN_VALUE(VALUE_FROM_UNDEFINED, rindex);
}